

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetworkList
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  char cVar1;
  ErrorCode EVar2;
  pointer pbVar3;
  string *psVar4;
  string *aDomainName;
  Registry *this_00;
  undefined1 *puVar5;
  size_type sVar6;
  value_t vVar7;
  json_value jVar8;
  Status SVar9;
  int iVar10;
  char *pcVar11;
  _Alloc_hider _Var12;
  Interpreter *this_01;
  element_type *peVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer pbVar14;
  element_type *peVar15;
  char *pcVar16;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  StringArray unresolved;
  writer write;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  networks;
  json json;
  Expression retExpr;
  Network nwk;
  string local_348;
  string *local_328;
  string *local_320;
  writer local_318 [3];
  undefined1 local_300 [8];
  _Alloc_hider local_2f8;
  char local_2e8 [16];
  _Alloc_hider local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 local_2b8 [32];
  format_string_checker<char> *local_298;
  parse_func local_290 [1];
  NetworkArray local_288;
  undefined1 local_268 [8];
  json_value local_260;
  json_value local_258;
  json_value local_250;
  undefined1 local_248 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  char local_218 [16];
  Expression local_208;
  undefined4 local_1f0;
  pointer local_1e8;
  pointer local_1e0;
  undefined1 local_1d8 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  element_type local_1b0;
  undefined1 local_1a0 [16];
  long local_190;
  undefined1 local_188 [16];
  undefined4 local_178;
  element_type *local_170;
  long local_168;
  element_type local_160;
  undefined4 local_150;
  element_type *local_148;
  long local_140;
  element_type local_138;
  undefined4 local_128;
  element_type *local_120;
  long local_118;
  element_type local_110;
  undefined4 local_100;
  element_type *local_f8;
  long local_f0;
  element_type local_e8;
  Error local_d8;
  string_t local_b0;
  Network local_90;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  persistent_storage::Network::Network(&local_90);
  local_288.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268[0] = null;
  local_260.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_268);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_268);
  ReParseMultiNetworkSyntax(&local_d8,this,aExpr,&local_208);
  local_300._0_4_ = local_d8.mCode;
  local_2f8._M_p = local_2e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,local_d8.mMessage._M_dataplus._M_p,
             local_d8.mMessage._M_dataplus._M_p + local_d8.mMessage._M_string_length);
  local_328 = (string *)&(__return_storage_ptr__->mError).mMessage;
  local_2d0 = 0;
  local_2c8._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_300._0_4_;
  local_2d8._M_p = (pointer)&local_2c8;
  std::__cxx11::string::operator=(local_328,(string *)&local_2f8);
  local_320 = (string *)&__return_storage_ptr__->mData;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)&local_2d8);
  EVar2 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_p != &local_2c8) {
    operator_delete(local_2d8._M_p);
  }
  if (local_2f8._M_p != local_2e8) {
    operator_delete(local_2f8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.mMessage._M_dataplus._M_p != &local_d8.mMessage.field_2) {
    operator_delete(local_d8.mMessage._M_dataplus._M_p);
  }
  if (EVar2 != kNone) goto LAB_001cb719;
  if ((ulong)((long)(this->mContext).mExportFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mContext).mExportFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    if (0x20 < (ulong)((long)(this->mContext).mImportFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->mContext).mImportFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      local_2b8._0_8_ = (ulong)(uint)local_2b8._4_4_ << 0x20;
      pcVar11 = "multiple files not allowed for --import";
      local_2b8._8_8_ = "multiple files not allowed for --import";
      local_2b8._16_8_ = 0x27;
      local_2b8._24_8_ = 0;
      local_290[0] = (parse_func)0x0;
      local_318[0].handler_ = (format_string_checker<char> *)local_2b8;
      local_298 = (format_string_checker<char> *)local_2b8;
      do {
        cVar1 = *pcVar11;
        pcVar16 = pcVar11;
        while (cVar1 != '{') {
          pcVar16 = pcVar16 + 1;
          if (pcVar16 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(local_318,pcVar11,"");
            goto LAB_001cae91;
          }
          cVar1 = *pcVar16;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(local_318,pcVar11,pcVar16);
        pcVar11 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar16,"",(format_string_checker<char> *)local_2b8);
      } while (pcVar11 != "");
LAB_001cae91:
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_2b8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_348,(v10 *)"multiple files not allowed for --import",
                 (string_view)ZEXT816(0x27),args_00);
      local_128 = 2;
      peVar15 = &local_110;
      local_120 = peVar15;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,local_348._M_dataplus._M_p,
                 local_348._M_dataplus._M_p + local_348._M_string_length);
      local_300._0_4_ = local_128;
      local_2f8._M_p = local_2e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,local_120,&local_120->mManageStorage + local_118);
      local_2d0 = 0;
      local_2c8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_300._0_4_;
      local_2d8._M_p = (pointer)&local_2c8;
      std::__cxx11::string::operator=(local_328,(string *)&local_2f8);
      std::__cxx11::string::operator=(local_320,(string *)&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_p != &local_2c8) {
        operator_delete(local_2d8._M_p);
      }
      peVar13 = local_120;
      if (local_2f8._M_p != local_2e8) {
        operator_delete(local_2f8._M_p);
        peVar13 = local_120;
      }
      goto LAB_001cb6fc;
    }
    pbVar14 = (this->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->mContext).mNwkAliases.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar4 = (this->mContext).mDomAliases.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    aDomainName = (this->mContext).mDomAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar3 == pbVar14) {
      this_00 = (this->mRegistry).
                super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if (psVar4 == aDomainName) {
        SVar9 = persistent_storage::Registry::GetAllNetworks(this_00,&local_288);
        if (kNotFound < SVar9) {
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_03.field_1.args_ = in_R9.args_;
          args_03.desc_ = (unsigned_long_long)&local_348;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_2b8,(v10 *)"Failed to find registry entity of type: network",
                     (string_view)ZEXT816(0x2f),args_03);
          local_1a0._0_4_ = 5;
          local_1a0._8_8_ = local_188;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_1a0 + 8),local_2b8._0_8_,
                     (char *)(local_2b8._8_8_ + local_2b8._0_8_));
          local_300._0_4_ = local_1a0._0_4_;
          local_2f8._M_p = local_2e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f8,local_1a0._8_8_,
                     (undefined1 *)(local_190 + local_1a0._8_8_));
          local_2d0 = 0;
          local_2c8._M_local_buf[0] = '\0';
          local_2d8._M_p = (pointer)&local_2c8;
          Value::operator=(__return_storage_ptr__,(Value *)local_300);
          Value::~Value((Value *)local_300);
          if ((undefined1 *)local_1a0._8_8_ != local_188) {
            operator_delete((void *)local_1a0._8_8_);
          }
          if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
      }
      else {
        SVar9 = persistent_storage::Registry::GetNetworksInDomain(this_00,aDomainName,&local_288);
        if (SVar9 != kSuccess) {
          local_2b8._0_4_ = string_type;
          pcVar11 = "failed to find networks in domain \'{}\'";
          local_2b8._8_8_ = "failed to find networks in domain \'{}\'";
          local_2b8._16_8_ = 0x26;
          local_2b8._24_8_ = 0x100000000;
          local_290[0] = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_318[0].handler_ = (format_string_checker<char> *)local_2b8;
          local_298 = (format_string_checker<char> *)local_2b8;
          do {
            cVar1 = *pcVar11;
            pcVar16 = pcVar11;
            while (cVar1 != '{') {
              pcVar16 = pcVar16 + 1;
              if (pcVar16 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)local_318,pcVar11,"");
                goto LAB_001cb467;
              }
              cVar1 = *pcVar16;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_318,pcVar11,pcVar16);
            pcVar11 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                (pcVar16,"",(format_string_checker<char> *)local_2b8);
          } while (pcVar11 != "");
LAB_001cb467:
          pbVar14 = (this->mContext).mDomAliases.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_2b8._0_8_ = (pbVar14->_M_dataplus)._M_p;
          local_2b8._8_8_ = pbVar14->_M_string_length;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0x26;
          args_04.field_1.args_ = in_R9.args_;
          args_04.desc_ = (unsigned_long_long)local_2b8;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_348,(v10 *)"failed to find networks in domain \'{}\'",fmt,args_04);
          local_178 = 5;
          peVar15 = &local_160;
          local_170 = peVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,local_348._M_dataplus._M_p,
                     local_348._M_dataplus._M_p + local_348._M_string_length);
          local_300._0_4_ = local_178;
          local_2f8._M_p = local_2e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f8,local_170,&local_170->mManageStorage + local_168);
          local_2d0 = 0;
          local_2c8._M_local_buf[0] = '\0';
          (__return_storage_ptr__->mError).mCode = local_300._0_4_;
          local_2d8._M_p = (pointer)&local_2c8;
          std::__cxx11::string::operator=(local_328,(string *)&local_2f8);
          std::__cxx11::string::operator=(local_320,(string *)&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_p != &local_2c8) {
            operator_delete(local_2d8._M_p);
          }
          peVar13 = local_170;
          if (local_2f8._M_p != local_2e8) {
            operator_delete(local_2f8._M_p);
            peVar13 = local_170;
          }
          goto LAB_001cb6fc;
        }
      }
    }
    else {
      if (psVar4 != aDomainName) {
        local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
        pcVar11 = "--nwk and --dom are mutually exclusive";
        local_2b8._8_8_ = "--nwk and --dom are mutually exclusive";
        local_2b8._16_8_ = 0x26;
        local_2b8._24_8_ = 0;
        local_290[0] = (parse_func)0x0;
        local_318[0].handler_ = (format_string_checker<char> *)local_2b8;
        local_298 = (format_string_checker<char> *)local_2b8;
        do {
          cVar1 = *pcVar11;
          pcVar16 = pcVar11;
          while (cVar1 != '{') {
            pcVar16 = pcVar16 + 1;
            if (pcVar16 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(local_318,pcVar11,"");
              goto LAB_001cb04d;
            }
            cVar1 = *pcVar16;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(local_318,pcVar11,pcVar16);
          pcVar11 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar16,"",(format_string_checker<char> *)local_2b8);
        } while (pcVar11 != "");
LAB_001cb04d:
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)local_2b8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_348,(v10 *)"--nwk and --dom are mutually exclusive",
                   (string_view)ZEXT816(0x26),args_01);
        local_150 = 2;
        peVar15 = &local_138;
        local_148 = peVar15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_348._M_dataplus._M_p,
                   local_348._M_dataplus._M_p + local_348._M_string_length);
        local_300._0_4_ = local_150;
        local_2f8._M_p = local_2e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,local_148,&local_148->mManageStorage + local_140);
        local_2d0 = 0;
        local_2c8._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_300._0_4_;
        local_2d8._M_p = (pointer)&local_2c8;
        std::__cxx11::string::operator=(local_328,(string *)&local_2f8);
        std::__cxx11::string::operator=(local_320,(string *)&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_p != &local_2c8) {
          operator_delete(local_2d8._M_p);
        }
        peVar13 = local_148;
        if (local_2f8._M_p != local_2e8) {
          operator_delete(local_2f8._M_p);
          peVar13 = local_148;
        }
        goto LAB_001cb6fc;
      }
      do {
        iVar10 = std::__cxx11::string::compare((char *)pbVar14);
        if (((iVar10 == 0) || (iVar10 = std::__cxx11::string::compare((char *)pbVar14), iVar10 == 0)
            ) && ((long)(this->mContext).mNwkAliases.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->mContext).mNwkAliases.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
          local_2b8._0_4_ = string_type;
          pcVar11 = "\'{}\' must not combine with any other network alias";
          local_2b8._8_8_ = "\'{}\' must not combine with any other network alias";
          local_2b8._16_8_ = 0x32;
          local_2b8._24_8_ = 0x100000000;
          local_290[0] = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_318[0].handler_ = (format_string_checker<char> *)local_2b8;
          local_298 = (format_string_checker<char> *)local_2b8;
          do {
            cVar1 = *pcVar11;
            pcVar16 = pcVar11;
            while (cVar1 != '{') {
              pcVar16 = pcVar16 + 1;
              if (pcVar16 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)local_318,pcVar11,"");
                goto LAB_001cb60a;
              }
              cVar1 = *pcVar16;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_318,pcVar11,pcVar16);
            pcVar11 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                (pcVar16,"",(format_string_checker<char> *)local_2b8);
          } while (pcVar11 != "");
LAB_001cb60a:
          local_2b8._0_8_ = (pbVar14->_M_dataplus)._M_p;
          local_2b8._8_8_ = pbVar14->_M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x32;
          args_05.field_1.args_ = in_R9.args_;
          args_05.desc_ = (unsigned_long_long)local_2b8;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_348,(v10 *)"\'{}\' must not combine with any other network alias",fmt_00
                     ,args_05);
          local_1d8._16_4_ = 2;
          peVar15 = &local_1b0;
          local_1d8._24_8_ = peVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_1d8 + 0x18),local_348._M_dataplus._M_p,
                     local_348._M_dataplus._M_p + local_348._M_string_length);
          local_300._0_4_ = local_1d8._16_4_;
          local_2f8._M_p = local_2e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f8,local_1d8._24_8_,
                     (long)&(local_1b8._M_pi)->_vptr__Sp_counted_base + local_1d8._24_8_);
          local_2d0 = 0;
          local_2c8._M_local_buf[0] = '\0';
          (__return_storage_ptr__->mError).mCode = local_300._0_4_;
          local_2d8._M_p = (pointer)&local_2c8;
          std::__cxx11::string::operator=(local_328,(string *)&local_2f8);
          std::__cxx11::string::operator=(local_320,(string *)&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_p != &local_2c8) {
            operator_delete(local_2d8._M_p);
          }
          peVar13 = (element_type *)local_1d8._24_8_;
          if (local_2f8._M_p != local_2e8) {
            operator_delete(local_2f8._M_p);
            peVar13 = (element_type *)local_1d8._24_8_;
          }
          goto LAB_001cb6fc;
        }
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar3);
      local_348._M_dataplus._M_p = (pointer)0x0;
      local_348._M_string_length = 0;
      local_348.field_2._M_allocated_capacity = 0;
      SVar9 = persistent_storage::Registry::GetNetworksByAliases
                        ((this->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(StringArray *)this,&local_288,(StringArray *)&local_348);
      sVar6 = local_348._M_string_length;
      if (local_348._M_dataplus._M_p != (pointer)local_348._M_string_length) {
        _Var12._M_p = local_348._M_dataplus._M_p;
        do {
          local_228._M_allocated_capacity = (size_type)local_218;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,*(long *)_Var12._M_p,
                     *(long *)((long)_Var12._M_p + 8) + *(long *)_Var12._M_p);
          local_248._0_8_ = local_248 + 0x10;
          this_01 = (Interpreter *)local_248;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,"failed to resolve","");
          PrintNetworkMessage(this_01,(string *)&local_228,(string *)local_248,kYellow);
          if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
            operator_delete((void *)local_248._0_8_);
          }
          if ((char *)local_228._M_allocated_capacity != local_218) {
            operator_delete((void *)local_228._M_allocated_capacity);
          }
          _Var12._M_p = _Var12._M_p + 0x20;
        } while (_Var12._M_p != (pointer)sVar6);
      }
      if (SVar9 != kSuccess) {
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        args_02.field_1.args_ = in_R9.args_;
        args_02.desc_ = (unsigned_long_long)local_318;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_2b8,(v10 *)"Failed to find registry entity of type: network",
                   (string_view)ZEXT816(0x2f),args_02);
        local_1f0 = 5;
        local_1e8 = (pointer)local_1d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_2b8._0_8_,(char *)(local_2b8._8_8_ + local_2b8._0_8_))
        ;
        local_300._0_4_ = local_1f0;
        local_2f8._M_p = local_2e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,local_1e8,
                   (undefined1 *)
                   ((long)&(local_1e0->_M_dataplus)._M_p + (long)&(local_1e8->_M_dataplus)._M_p));
        local_2d0 = 0;
        local_2c8._M_local_buf[0] = '\0';
        local_2d8._M_p = (pointer)&local_2c8;
        Value::operator=(__return_storage_ptr__,(Value *)local_300);
        Value::~Value((Value *)local_300);
        if (local_1e8 != (pointer)local_1d8) {
          operator_delete(local_1e8);
        }
        if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
          operator_delete((void *)local_2b8._0_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_348);
        goto LAB_001cb719;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
    }
    local_250.object = (object_t *)0x0;
    local_258.boolean = true;
    local_300 = (undefined1  [8])
                local_288.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_2b8._0_8_ =
         local_288.
         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_250.object =
         (object_t *)
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::
         create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>>
                   ((__normal_iterator<const_ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                     *)local_300,
                    (__normal_iterator<const_ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                     *)local_2b8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_258);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_258);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_258);
    jVar8 = local_260;
    vVar7 = local_268[0];
    local_268[0] = local_258.boolean;
    local_258.boolean = (boolean_t)vVar7;
    local_260.string = local_250.string;
    local_250 = jVar8;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_268);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_258);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&local_250.boolean,local_258.boolean);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&local_b0,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_268,4,' ',false,strict);
    Value::Value((Value *)local_300,&local_b0);
    (__return_storage_ptr__->mError).mCode = local_300._0_4_;
    std::__cxx11::string::operator=(local_328,(string *)&local_2f8);
    std::__cxx11::string::operator=(local_320,(string *)&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != &local_2c8) {
      operator_delete(local_2d8._M_p);
    }
    if (local_2f8._M_p != local_2e8) {
      operator_delete(local_2f8._M_p);
    }
    psVar4 = &local_b0;
  }
  else {
    local_2b8._0_8_ = (ulong)(uint)local_2b8._4_4_ << 0x20;
    pcVar11 = "multiple files not allowed for --export";
    local_2b8._8_8_ = "multiple files not allowed for --export";
    local_2b8._16_8_ = 0x27;
    local_2b8._24_8_ = 0;
    local_290[0] = (parse_func)0x0;
    local_318[0].handler_ = (format_string_checker<char> *)local_2b8;
    local_298 = (format_string_checker<char> *)local_2b8;
    do {
      cVar1 = *pcVar11;
      pcVar16 = pcVar11;
      while (cVar1 != '{') {
        pcVar16 = pcVar16 + 1;
        if (pcVar16 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(local_318,pcVar11,"");
          goto LAB_001cad0d;
        }
        cVar1 = *pcVar16;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(local_318,pcVar11,pcVar16);
      pcVar11 = ::fmt::v10::detail::
                parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                          (pcVar16,"",(format_string_checker<char> *)local_2b8);
    } while (pcVar11 != "");
LAB_001cad0d:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_2b8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_348,(v10 *)"multiple files not allowed for --export",
               (string_view)ZEXT816(0x27),args);
    local_100 = 2;
    peVar15 = &local_e8;
    local_f8 = peVar15;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_348._M_dataplus._M_p,
               local_348._M_dataplus._M_p + local_348._M_string_length);
    local_300._0_4_ = local_100;
    local_2f8._M_p = local_2e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8,local_f8,&local_f8->mManageStorage + local_f0);
    local_2d0 = 0;
    local_2c8._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_300._0_4_;
    local_2d8._M_p = (pointer)&local_2c8;
    std::__cxx11::string::operator=(local_328,(string *)&local_2f8);
    std::__cxx11::string::operator=(local_320,(string *)&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != &local_2c8) {
      operator_delete(local_2d8._M_p);
    }
    peVar13 = local_f8;
    if (local_2f8._M_p != local_2e8) {
      operator_delete(local_2f8._M_p);
      peVar13 = local_f8;
    }
LAB_001cb6fc:
    if (peVar13 != peVar15) {
      operator_delete(peVar13);
    }
    psVar4 = &local_348;
  }
  puVar5 = (undefined1 *)(&(psVar4->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5 != &psVar4->field_2) {
    operator_delete(puVar5);
  }
LAB_001cb719:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_268);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_268 + 8),local_268[0]);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mMlp._M_dataplus._M_p != &local_90.mMlp.field_2) {
    operator_delete(local_90.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mName._M_dataplus._M_p != &local_90.mName.field_2) {
    operator_delete(local_90.mName._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetworkList(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Interpreter::Value   value;
    Expression           retExpr;
    Network              nwk{};
    std::vector<Network> networks;
    ::nlohmann::json     json;

    SuccessOrExit(value = ReParseMultiNetworkSyntax(aExpr, retExpr));
    // export file specification must be single or omitted
    VerifyOrExit(mContext.mExportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_EXPORT));
    // import file specification must be single or omitted
    VerifyOrExit(mContext.mImportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_IMPORT));
    // network and domain must not be specified simultaneously
    VerifyOrExit(mContext.mNwkAliases.size() == 0 || mContext.mDomAliases.size() == 0,
                 value = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));

    if (mContext.mDomAliases.size() > 0)
    {
        VerifyOrExit(mRegistry->GetNetworksInDomain(mContext.mDomAliases[0], networks) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("failed to find networks in domain '{}'", mContext.mDomAliases[0]));
    }
    else if (mContext.mNwkAliases.size() == 0)
    {
        RegistryStatus status = mRegistry->GetAllNetworks(networks);
        if (status != RegistryStatus::kSuccess && status != RegistryStatus::kNotFound)
        {
            value = ERROR_NOT_FOUND(NOT_FOUND_STR NETWORK_STR);
        }
    }
    else
    {
        // Quickly check group aliases
        for (const auto &alias : mContext.mNwkAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
                VerifyOrExit(mContext.mNwkAliases.size() == 1, value = ERROR_INVALID_ARGS(SYNTAX_GROUP_ALIAS, alias));
        }

        StringArray    unresolved;
        RegistryStatus status = mRegistry->GetNetworksByAliases(mContext.mNwkAliases, networks, unresolved);
        for (const auto &alias : unresolved)
        {
            PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
        }
        VerifyOrExit(status == RegistryStatus::kSuccess, value = ERROR_NOT_FOUND(NOT_FOUND_STR NETWORK_STR));
    }

    json  = networks;
    value = json.dump(JSON_INDENT_DEFAULT);

exit:
    return value;
}